

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O2

void __thiscall Circuit::sort(Circuit *this,bool test)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  pointer puVar4;
  ostream *poVar5;
  int iVar6;
  undefined7 in_register_00000031;
  uint j;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint i;
  uint uVar10;
  ulong uVar11;
  reference rVar12;
  vector<bool,_std::allocator<bool>_> used;
  allocator_type local_5d;
  undefined4 local_5c;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_5c = (undefined4)CONCAT71(in_register_00000031,test);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,(ulong)this->nWires,&local_5d);
  for (uVar11 = 0; uVar11 < this->nWires; uVar11 = uVar11 + 1) {
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&local_58,uVar11);
    *rVar12._M_p = *rVar12._M_p & ~rVar12._M_mask;
  }
  puVar4 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  for (uVar10 = 0;
      (ulong)uVar10 <
      (ulong)((long)(this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2);
      uVar10 = uVar10 + 1) {
    for (uVar7 = 0; uVar7 < puVar4[uVar10]; uVar7 = uVar7 + 1) {
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_58,(ulong)(uVar9 + uVar7));
      *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
      puVar4 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    uVar9 = uVar9 + uVar7;
  }
  uVar11 = 0;
  do {
    uVar9 = (uint)uVar11;
    if ((ulong)((long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar11) {
      recompute_map(this);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
      return;
    }
    if ((char)local_5c != '\0') {
      bVar3 = gate_is_ok(this,uVar9,(vector<bool,_std::allocator<bool>_> *)&local_58);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Problem in topological sort");
        std::endl<char,std::char_traits<char>>(poVar5);
LAB_00104be2:
        abort();
      }
    }
    iVar6 = 0;
    uVar8 = uVar11;
    while( true ) {
      uVar10 = (uint)uVar8;
      bVar3 = gate_is_ok(this,uVar10,(vector<bool,_std::allocator<bool>_> *)&local_58);
      if (bVar3) break;
      uVar8 = (ulong)(uVar10 + 1);
      iVar6 = iVar6 + -1;
      if ((long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == uVar8) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Problem in conversion with (current) gate ")
        ;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
        output_gate(this,(ostream *)&std::cout,uVar9);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        goto LAB_00104be2;
      }
    }
    if (iVar6 != 0) {
      swap_gate(this,uVar9,uVar10);
    }
    uVar10 = 0;
    while( true ) {
      pvVar1 = (this->GateO).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[uVar11].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar1[uVar11].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar10
         ) break;
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_58,
                          (ulong)*(uint *)(lVar2 + (ulong)uVar10 * 4));
      *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
      uVar10 = uVar10 + 1;
    }
    uVar11 = (ulong)(uVar9 + 1);
  } while( true );
}

Assistant:

void Circuit::sort(bool test) {
  vector<bool> used(nWires);
  for (unsigned int i = 0; i < nWires; i++) {
    used[i] = false;
  }

  // Define inputs
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < numI.size(); i++) {
    for (unsigned int j = 0; j < numI[i]; j++) {
      used[cnt] = true;
      cnt++;
    }
  }

  // Now go through each gate and work out if defined inputs or not
  for (unsigned int i = 0; i < GateT.size(); i++) { // Find next ok gate
    unsigned int j = i;
    if (test && gate_is_ok(i, used) == false) {
      cout << "Problem in topological sort" << endl;
      abort();
    } else {
      while (gate_is_ok(j, used) == false) {
        j++;
        if (j == GateT.size()) {
          cout << "Problem in conversion with (current) gate " << i << endl;
          output_gate(cout, i);
          cout << endl;
          abort();
        }
      }
      // Swap gate i and gate j if i<>j
      if (i != j) {
        swap_gate(i, j);
      }
    }
    // Set output wires to be OK
    for (unsigned int j = 0; j < GateO[i].size(); j++) {
      used[GateO[i][j]] = true;
    }
  }
  recompute_map();
}